

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O2

bool __thiscall
boost::spirit::karma::
base_sequence<boost::fusion::cons<boost::spirit::karma::lazy_generator<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::greater_equal,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::karma::lazy_generator<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<b...::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,boost::fusion::nil_>>>>>
::
generate_impl<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type_const,mpl_::bool_<false>,mpl_::bool_<false>>
          (base_sequence<boost::fusion::cons<boost::spirit::karma::lazy_generator<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::greater_equal,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::karma::lazy_generator<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<b___::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,boost::fusion::nil_>>>>>
           *this,undefined8 sink,undefined8 ctx,unused_type *d)

{
  fail_function<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>,_const_boost::spirit::unused_type,_boost::spirit::unused_type>
  f;
  bool bVar1;
  
  f.ctx = (unused_type *)ctx;
  f.sink = (output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
            *)sink;
  f.delim = d;
  bVar1 = fusion::
          any<boost::fusion::cons<boost::spirit::karma::lazy_generator<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::greater_equal,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>>,0l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>,boost::spirit::unused_type>,boost::fusion::cons<boost::spirit::karma::lazy_generator<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::prot___::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type>>
                    ((cons<boost::spirit::karma::lazy_generator<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::greater_equal,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::karma::lazy_generator<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::less,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_int>_>,_0L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>_>,_boost::spirit::unused_type>,_boost::fusion::cons<boost::spirit::karma::action<boost::spirit::karma::eps_generator,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_char>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_boost::fusion::nil_>_>_>
                      *)this,f);
  return !bVar1;
}

Assistant:

bool generate_impl(OutputIterator& sink, Context& ctx
          , Delimiter const& d, Attribute& attr_, Pred1, Pred2) const
        {
            typedef detail::fail_function<
                OutputIterator, Context, Delimiter> fail_function;
            typedef traits::attribute_not_unused<Context> predicate;

            // wrap the attribute in a tuple if it is not a tuple or if the
            // attribute of this sequence is a single element tuple
            typedef typename attribute<Context>::type_ attr_type_;
            typename traits::wrap_if_not_tuple<Attribute
              , typename mpl::and_<
                    traits::one_element_sequence<attr_type_>
                  , mpl::not_<traits::one_element_sequence<Attribute> >
                >::type
            >::type attr(attr_);

            // return false if *any* of the generators fail
            bool r = spirit::any_if(elements, attr
                          , fail_function(sink, ctx, d), predicate());

            typedef typename traits::attribute_size<Attribute>::type size_type;

            // fail generating if sequences have not the same (logical) length
            return !r && (!Strict::value ||
                // This ignores container element count (which is not good),
                // but allows valid attributes to succeed. This will lead to
                // false positives (failing generators, even if they shouldn't)
                // if the embedded component is restricting the number of
                // container elements it consumes (i.e. repeat). This solution
                // is not optimal but much better than letting _all_ repetitive
                // components fail.
                Pred1::value ||
                size_type(traits::sequence_size<attr_type_>::value) == traits::size(attr_));
        }